

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegtran.c
# Opt level: O3

int parse_switches(j_compress_ptr cinfo,int argc,char **argv,int last_file_arg_seen,boolean for_real
                  )

{
  int *piVar1;
  boolean bVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  char *pcVar6;
  JXFORM_CODE transform;
  char ch;
  long lval;
  byte local_4d;
  int local_4c;
  ulong local_48;
  int local_3c;
  char *local_38;
  
  icc_filename = (char *)0x0;
  max_scans = 0;
  outfilename = (char *)0x0;
  report = 0;
  strict = 0;
  copyoption = JCOPYOPT_COMMENTS;
  transformoption.transform = JXFORM_NONE;
  transformoption.perfect = 0;
  transformoption.trim = 0;
  transformoption.force_grayscale = 0;
  transformoption.crop = 0;
  transformoption.slow_hflip = 0;
  cinfo->err->trace_level = 0;
  if (argc < 2) {
    return 1;
  }
  iVar5 = 1;
  local_38 = (char *)0x0;
  local_4c = 0;
  local_3c = last_file_arg_seen;
LAB_00105bc1:
  pcVar6 = argv[iVar5];
  if (*pcVar6 == '-') {
    pcVar6 = pcVar6 + 1;
    bVar2 = keymatch(pcVar6,"arithmetic",1);
    if (bVar2 == 0) {
      bVar2 = keymatch(pcVar6,"copy",2);
      if (bVar2 == 0) {
        bVar2 = keymatch(pcVar6,"crop",2);
        if (bVar2 == 0) {
          bVar2 = keymatch(pcVar6,"drop",2);
          if (bVar2 == 0) {
            bVar2 = keymatch(pcVar6,"debug",1);
            if ((bVar2 != 0) || (bVar2 = keymatch(pcVar6,"verbose",1), bVar2 != 0)) {
              if (parse_switches_printed_version == '\0') {
                parse_switches_cold_3();
              }
              piVar1 = &cinfo->err->trace_level;
              *piVar1 = *piVar1 + 1;
              goto LAB_00105c05;
            }
            bVar2 = keymatch(pcVar6,"version",4);
            if (bVar2 != 0) goto LAB_0010633e;
            bVar2 = keymatch(pcVar6,"flip",1);
            if (bVar2 == 0) {
              bVar2 = keymatch(pcVar6,"grayscale",1);
              if ((bVar2 != 0) || (bVar2 = keymatch(pcVar6,"greyscale",1), bVar2 != 0)) {
                transformoption.force_grayscale = 1;
                goto LAB_00105c05;
              }
              bVar2 = keymatch(pcVar6,"icc",1);
              if (bVar2 != 0) {
                iVar5 = iVar5 + 1;
                if (argc <= iVar5) goto LAB_00106323;
                icc_filename = argv[iVar5];
                goto LAB_00105c05;
              }
              bVar2 = keymatch(pcVar6,"maxmemory",3);
              if (bVar2 != 0) {
                local_4d = 0x78;
                iVar5 = iVar5 + 1;
                if ((argc <= iVar5) ||
                   (iVar3 = __isoc99_sscanf(argv[iVar5],"%ld%c",&local_48,&local_4d), iVar3 < 1))
                goto LAB_00106323;
                uVar4 = local_48 * 1000;
                if ((local_4d & 0xdf) != 0x4d) {
                  uVar4 = local_48;
                }
                cinfo->mem->max_memory_to_use = uVar4 * 1000;
                goto LAB_00105c05;
              }
              bVar2 = keymatch(pcVar6,"maxscans",4);
              if (bVar2 != 0) {
                iVar5 = iVar5 + 1;
                if ((argc <= iVar5) ||
                   (iVar3 = __isoc99_sscanf(argv[iVar5],"%u",&max_scans), iVar3 != 1))
                goto LAB_00106323;
                goto LAB_00105c05;
              }
              bVar2 = keymatch(pcVar6,"optimize",1);
              if ((bVar2 != 0) || (bVar2 = keymatch(pcVar6,"optimise",1), bVar2 != 0)) {
                cinfo->optimize_coding = 1;
                goto LAB_00105c05;
              }
              bVar2 = keymatch(pcVar6,"outfile",4);
              if (bVar2 != 0) {
                iVar5 = iVar5 + 1;
                if (argc <= iVar5) goto LAB_00106323;
                outfilename = argv[iVar5];
                goto LAB_00105c05;
              }
              bVar2 = keymatch(pcVar6,"perfect",2);
              if (bVar2 != 0) {
                transformoption.perfect = 1;
                goto LAB_00105c05;
              }
              bVar2 = keymatch(pcVar6,"progressive",2);
              if (bVar2 != 0) {
                local_4c = 1;
                goto LAB_00105c05;
              }
              bVar2 = keymatch(pcVar6,"report",3);
              if (bVar2 != 0) {
                report = 1;
                goto LAB_00105c05;
              }
              bVar2 = keymatch(pcVar6,"restart",1);
              if (bVar2 != 0) {
                local_4d = 0x78;
                iVar5 = iVar5 + 1;
                if (((argc <= iVar5) ||
                    (iVar3 = __isoc99_sscanf(argv[iVar5],"%ld%c",&local_48,&local_4d), iVar3 < 1))
                   || (0xffff < local_48)) goto LAB_00106323;
                uVar4 = local_48;
                if ((local_4d & 0xdf) == 0x42) {
                  cinfo->restart_interval = (uint)local_48;
                  uVar4 = 0;
                }
                cinfo->restart_in_rows = (int)uVar4;
                goto LAB_00105c05;
              }
              bVar2 = keymatch(pcVar6,"rotate",2);
              if (bVar2 == 0) {
                bVar2 = keymatch(pcVar6,"scans",1);
                if (bVar2 != 0) {
                  iVar5 = iVar5 + 1;
                  if (argc <= iVar5) goto LAB_00106323;
                  local_38 = argv[iVar5];
                  goto LAB_00105c05;
                }
                bVar2 = keymatch(pcVar6,"strict",2);
                if (bVar2 != 0) {
                  strict = 1;
                  goto LAB_00105c05;
                }
                bVar2 = keymatch(pcVar6,"transpose",1);
                if (bVar2 == 0) {
                  bVar2 = keymatch(pcVar6,"transverse",6);
                  if (bVar2 == 0) {
                    bVar2 = keymatch(pcVar6,"trim",3);
                    if (bVar2 != 0) {
                      transformoption.trim = 1;
                      goto LAB_00105c05;
                    }
                    bVar2 = keymatch(pcVar6,"wipe",1);
                    if ((bVar2 != 0) && (iVar5 = iVar5 + 1, iVar5 < argc)) {
                      pcVar6 = (char *)(long)iVar5;
                      if ((transformoption.crop == 0) &&
                         (bVar2 = jtransform_parse_crop_spec(&transformoption,argv[(long)pcVar6]),
                         bVar2 != 0)) {
                        transform = JXFORM_WIPE;
                        goto LAB_00105d61;
                      }
                      goto LAB_00106343;
                    }
                    goto LAB_00106323;
                  }
                  transform = JXFORM_TRANSVERSE;
                }
                else {
                  transform = JXFORM_TRANSPOSE;
                }
              }
              else {
                iVar5 = iVar5 + 1;
                if (argc <= iVar5) goto LAB_00106323;
                pcVar6 = (char *)(long)iVar5;
                bVar2 = keymatch(argv[(long)pcVar6],"90",2);
                if (bVar2 == 0) {
                  bVar2 = keymatch(argv[(long)pcVar6],"180",3);
                  if (bVar2 != 0) {
                    transform = JXFORM_ROT_180;
                    goto LAB_00105d61;
                  }
                  bVar2 = keymatch(argv[(long)pcVar6],"270",3);
                  if (bVar2 == 0) goto LAB_00106323;
                  transform = JXFORM_ROT_270;
                }
                else {
                  transform = JXFORM_ROT_90;
                }
              }
            }
            else {
              iVar5 = iVar5 + 1;
              if (argc <= iVar5) goto LAB_00106323;
              pcVar6 = (char *)(long)iVar5;
              bVar2 = keymatch(argv[(long)pcVar6],"horizontal",1);
              if (bVar2 != 0) {
                transform = JXFORM_FLIP_H;
                goto LAB_00105d61;
              }
              bVar2 = keymatch(argv[(long)pcVar6],"vertical",1);
              if (bVar2 == 0) goto LAB_00106323;
              transform = JXFORM_FLIP_V;
            }
          }
          else {
            if (argc <= iVar5 + 1) goto LAB_00106323;
            pcVar6 = (char *)(long)(iVar5 + 1);
            if ((((transformoption.crop != 0) ||
                 (bVar2 = jtransform_parse_crop_spec(&transformoption,argv[(long)pcVar6]),
                 bVar2 == 0)) || (transformoption.crop_width_set != JCROP_UNSET)) ||
               (transformoption.crop_height_set != JCROP_UNSET)) goto LAB_00106333;
            iVar5 = iVar5 + 2;
            if (argc <= iVar5) goto LAB_00106323;
            dropfilename = argv[iVar5];
            transform = JXFORM_DROP;
          }
LAB_00105d61:
          select_transform(transform);
        }
        else {
          iVar5 = iVar5 + 1;
          if (argc <= iVar5) goto LAB_00106323;
          pcVar6 = (char *)(long)iVar5;
          if ((transformoption.crop != 0) ||
             (bVar2 = jtransform_parse_crop_spec(&transformoption,argv[(long)pcVar6]), bVar2 == 0))
          goto LAB_00106328;
        }
      }
      else {
        iVar5 = iVar5 + 1;
        if (argc <= iVar5) goto LAB_00106323;
        pcVar6 = (char *)(long)iVar5;
        bVar2 = keymatch(argv[(long)pcVar6],"none",1);
        if (bVar2 == 0) {
          bVar2 = keymatch(argv[(long)pcVar6],"comments",1);
          if (bVar2 == 0) {
            bVar2 = keymatch(argv[(long)pcVar6],"icc",1);
            if (bVar2 == 0) {
              bVar2 = keymatch(argv[(long)pcVar6],"all",1);
              if (bVar2 == 0) goto LAB_00106323;
              copyoption = JCOPYOPT_ALL;
            }
            else {
              copyoption = JCOPYOPT_ICC;
            }
          }
          else {
            copyoption = JCOPYOPT_COMMENTS;
          }
        }
        else {
          copyoption = JCOPYOPT_NONE;
        }
      }
    }
    else {
      cinfo->arith_code = 1;
    }
  }
  else {
    if (0 < iVar5) goto LAB_001062e6;
    outfilename = (char *)0x0;
  }
LAB_00105c05:
  iVar5 = iVar5 + 1;
  if (argc <= iVar5) {
LAB_001062e6:
    if (local_3c != 0) {
      if (local_4c != 0) {
        jpeg_simple_progression(cinfo);
      }
      if ((local_38 != (char *)0x0) && (bVar2 = read_scan_script(cinfo,local_38), bVar2 == 0)) {
LAB_00106323:
        usage();
LAB_00106328:
        parse_switches_cold_1();
LAB_00106333:
        parse_switches_cold_2();
LAB_0010633e:
        iVar5 = (int)pcVar6;
        parse_switches_cold_4();
LAB_00106343:
        parse_switches_cold_5();
        pcVar6 = *argv;
        if (-1 < iVar5) {
          if (*(int *)(pcVar6 + 0x7c) < iVar5) {
            return (int)pcVar6;
          }
          pcVar6 = pcVar6 + 0x10;
        }
        iVar5 = (**(code **)pcVar6)();
        return iVar5;
      }
    }
    return iVar5;
  }
  goto LAB_00105bc1;
}

Assistant:

LOCAL(int)
parse_switches(j_compress_ptr cinfo, int argc, char **argv,
               int last_file_arg_seen, boolean for_real)
/* Parse optional switches.
 * Returns argv[] index of first file-name argument (== argc if none).
 * Any file names with indexes <= last_file_arg_seen are ignored;
 * they have presumably been processed in a previous iteration.
 * (Pass 0 for last_file_arg_seen on the first or only iteration.)
 * for_real is FALSE on the first (dummy) pass; we may skip any expensive
 * processing.
 */
{
  int argn;
  char *arg;
  boolean simple_progressive;
  char *scansarg = NULL;        /* saves -scans parm if any */

  /* Set up default JPEG parameters. */
  simple_progressive = FALSE;
  icc_filename = NULL;
  max_scans = 0;
  outfilename = NULL;
  report = FALSE;
  strict = FALSE;
  copyoption = JCOPYOPT_DEFAULT;
  transformoption.transform = JXFORM_NONE;
  transformoption.perfect = FALSE;
  transformoption.trim = FALSE;
  transformoption.force_grayscale = FALSE;
  transformoption.crop = FALSE;
  transformoption.slow_hflip = FALSE;
  cinfo->err->trace_level = 0;

  /* Scan command line options, adjust parameters */

  for (argn = 1; argn < argc; argn++) {
    arg = argv[argn];
    if (*arg != '-') {
      /* Not a switch, must be a file name argument */
      if (argn <= last_file_arg_seen) {
        outfilename = NULL;     /* -outfile applies to just one input file */
        continue;               /* ignore this name if previously processed */
      }
      break;                    /* else done parsing switches */
    }
    arg++;                      /* advance past switch marker character */

    if (keymatch(arg, "arithmetic", 1)) {
      /* Use arithmetic coding. */
#ifdef C_ARITH_CODING_SUPPORTED
      cinfo->arith_code = TRUE;
#else
      fprintf(stderr, "%s: sorry, arithmetic coding not supported\n",
              progname);
      exit(EXIT_FAILURE);
#endif

    } else if (keymatch(arg, "copy", 2)) {
      /* Select which extra markers to copy. */
      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (keymatch(argv[argn], "none", 1)) {
        copyoption = JCOPYOPT_NONE;
      } else if (keymatch(argv[argn], "comments", 1)) {
        copyoption = JCOPYOPT_COMMENTS;
      } else if (keymatch(argv[argn], "icc", 1)) {
        copyoption = JCOPYOPT_ICC;
      } else if (keymatch(argv[argn], "all", 1)) {
        copyoption = JCOPYOPT_ALL;
      } else
        usage();

    } else if (keymatch(arg, "crop", 2)) {
      /* Perform lossless cropping. */
#if TRANSFORMS_SUPPORTED
      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (transformoption.crop /* reject multiple crop/drop/wipe requests */ ||
          !jtransform_parse_crop_spec(&transformoption, argv[argn])) {
        fprintf(stderr, "%s: bogus -crop argument '%s'\n",
                progname, argv[argn]);
        exit(EXIT_FAILURE);
      }
#else
      select_transform(JXFORM_NONE);    /* force an error */
#endif

    } else if (keymatch(arg, "drop", 2)) {
#if TRANSFORMS_SUPPORTED
      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (transformoption.crop /* reject multiple crop/drop/wipe requests */ ||
          !jtransform_parse_crop_spec(&transformoption, argv[argn]) ||
          transformoption.crop_width_set != JCROP_UNSET ||
          transformoption.crop_height_set != JCROP_UNSET) {
        fprintf(stderr, "%s: bogus -drop argument '%s'\n",
                progname, argv[argn]);
        exit(EXIT_FAILURE);
      }
      if (++argn >= argc)       /* advance to next argument */
        usage();
      dropfilename = argv[argn];
      select_transform(JXFORM_DROP);
#else
      select_transform(JXFORM_NONE);    /* force an error */
#endif

    } else if (keymatch(arg, "debug", 1) || keymatch(arg, "verbose", 1)) {
      /* Enable debug printouts. */
      /* On first -d, print version identification */
      static boolean printed_version = FALSE;

      if (!printed_version) {
        fprintf(stderr, "%s version %s (build %s)\n",
                PACKAGE_NAME, VERSION, BUILD);
        fprintf(stderr, "%s\n\n", JCOPYRIGHT);
        fprintf(stderr, "Emulating The Independent JPEG Group's software, version %s\n\n",
                JVERSION);
        printed_version = TRUE;
      }
      cinfo->err->trace_level++;

    } else if (keymatch(arg, "version", 4)) {
      fprintf(stderr, "%s version %s (build %s)\n",
              PACKAGE_NAME, VERSION, BUILD);
      exit(EXIT_SUCCESS);

    } else if (keymatch(arg, "flip", 1)) {
      /* Mirror left-right or top-bottom. */
      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (keymatch(argv[argn], "horizontal", 1))
        select_transform(JXFORM_FLIP_H);
      else if (keymatch(argv[argn], "vertical", 1))
        select_transform(JXFORM_FLIP_V);
      else
        usage();

    } else if (keymatch(arg, "grayscale", 1) ||
               keymatch(arg, "greyscale", 1)) {
      /* Force to grayscale. */
#if TRANSFORMS_SUPPORTED
      transformoption.force_grayscale = TRUE;
#else
      select_transform(JXFORM_NONE);    /* force an error */
#endif

    } else if (keymatch(arg, "icc", 1)) {
      /* Set ICC filename. */
      if (++argn >= argc)       /* advance to next argument */
        usage();
      icc_filename = argv[argn];

    } else if (keymatch(arg, "maxmemory", 3)) {
      /* Maximum memory in Kb (or Mb with 'm'). */
      long lval;
      char ch = 'x';

      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (sscanf(argv[argn], "%ld%c", &lval, &ch) < 1)
        usage();
      if (ch == 'm' || ch == 'M')
        lval *= 1000L;
      cinfo->mem->max_memory_to_use = lval * 1000L;

    } else if (keymatch(arg, "maxscans", 4)) {
      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (sscanf(argv[argn], "%u", &max_scans) != 1)
        usage();

    } else if (keymatch(arg, "optimize", 1) || keymatch(arg, "optimise", 1)) {
      /* Enable entropy parm optimization. */
#ifdef ENTROPY_OPT_SUPPORTED
      cinfo->optimize_coding = TRUE;
#else
      fprintf(stderr, "%s: sorry, entropy optimization was not compiled\n",
              progname);
      exit(EXIT_FAILURE);
#endif

    } else if (keymatch(arg, "outfile", 4)) {
      /* Set output file name. */
      if (++argn >= argc)       /* advance to next argument */
        usage();
      outfilename = argv[argn]; /* save it away for later use */

    } else if (keymatch(arg, "perfect", 2)) {
      /* Fail if there is any partial edge MCUs that the transform can't
       * handle. */
      transformoption.perfect = TRUE;

    } else if (keymatch(arg, "progressive", 2)) {
      /* Select simple progressive mode. */
#ifdef C_PROGRESSIVE_SUPPORTED
      simple_progressive = TRUE;
      /* We must postpone execution until num_components is known. */
#else
      fprintf(stderr, "%s: sorry, progressive output was not compiled\n",
              progname);
      exit(EXIT_FAILURE);
#endif

    } else if (keymatch(arg, "report", 3)) {
      report = TRUE;

    } else if (keymatch(arg, "restart", 1)) {
      /* Restart interval in MCU rows (or in MCUs with 'b'). */
      long lval;
      char ch = 'x';

      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (sscanf(argv[argn], "%ld%c", &lval, &ch) < 1)
        usage();
      if (lval < 0 || lval > 65535L)
        usage();
      if (ch == 'b' || ch == 'B') {
        cinfo->restart_interval = (unsigned int)lval;
        cinfo->restart_in_rows = 0; /* else prior '-restart n' overrides me */
      } else {
        cinfo->restart_in_rows = (int)lval;
        /* restart_interval will be computed during startup */
      }

    } else if (keymatch(arg, "rotate", 2)) {
      /* Rotate 90, 180, or 270 degrees (measured clockwise). */
      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (keymatch(argv[argn], "90", 2))
        select_transform(JXFORM_ROT_90);
      else if (keymatch(argv[argn], "180", 3))
        select_transform(JXFORM_ROT_180);
      else if (keymatch(argv[argn], "270", 3))
        select_transform(JXFORM_ROT_270);
      else
        usage();

    } else if (keymatch(arg, "scans", 1)) {
      /* Set scan script. */
#ifdef C_MULTISCAN_FILES_SUPPORTED
      if (++argn >= argc)       /* advance to next argument */
        usage();
      scansarg = argv[argn];
      /* We must postpone reading the file in case -progressive appears. */
#else
      fprintf(stderr, "%s: sorry, multi-scan output was not compiled\n",
              progname);
      exit(EXIT_FAILURE);
#endif

    } else if (keymatch(arg, "strict", 2)) {
      strict = TRUE;

    } else if (keymatch(arg, "transpose", 1)) {
      /* Transpose (across UL-to-LR axis). */
      select_transform(JXFORM_TRANSPOSE);

    } else if (keymatch(arg, "transverse", 6)) {
      /* Transverse transpose (across UR-to-LL axis). */
      select_transform(JXFORM_TRANSVERSE);

    } else if (keymatch(arg, "trim", 3)) {
      /* Trim off any partial edge MCUs that the transform can't handle. */
      transformoption.trim = TRUE;

    } else if (keymatch(arg, "wipe", 1)) {
#if TRANSFORMS_SUPPORTED
      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (transformoption.crop /* reject multiple crop/drop/wipe requests */ ||
          !jtransform_parse_crop_spec(&transformoption, argv[argn])) {
        fprintf(stderr, "%s: bogus -wipe argument '%s'\n",
                progname, argv[argn]);
        exit(EXIT_FAILURE);
      }
      select_transform(JXFORM_WIPE);
#else
      select_transform(JXFORM_NONE);    /* force an error */
#endif

    } else {
      usage();                  /* bogus switch */
    }
  }

  /* Post-switch-scanning cleanup */

  if (for_real) {

#ifdef C_PROGRESSIVE_SUPPORTED
    if (simple_progressive)     /* process -progressive; -scans can override */
      jpeg_simple_progression(cinfo);
#endif

#ifdef C_MULTISCAN_FILES_SUPPORTED
    if (scansarg != NULL)       /* process -scans if it was present */
      if (!read_scan_script(cinfo, scansarg))
        usage();
#endif
  }

  return argn;                  /* return index of next arg (file name) */
}